

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.c
# Opt level: O0

_Bool console_has_mixed_input_stream(Seat *seat)

{
  _Bool _Var1;
  Seat *seat_local;
  
  _Var1 = is_interactive();
  if ((_Var1) && ((console_antispoof_prompt & 1U) != 0)) {
    seat_local._7_1_ = true;
  }
  else {
    seat_local._7_1_ = false;
  }
  return seat_local._7_1_;
}

Assistant:

bool console_has_mixed_input_stream(Seat *seat)
{
    if (!is_interactive() || !console_antispoof_prompt) {
        /*
         * If standard input isn't connected to a terminal, then even
         * if the server did send a spoof authentication prompt, the
         * user couldn't respond to it via the terminal anyway.
         *
         * We also pretend this is true if the user has purposely
         * disabled the antispoof prompt.
         */
        return false;
    }

    return true;
}